

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocated<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_>
          *value)

{
  Arena *my_arena;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Nullable<const_char_*> failure_msg;
  void **ppvVar5;
  Rep *pRVar6;
  int __old_val;
  Arena *value_arena;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_> *local_38;
  LogMessage local_30;
  
  local_30.errno_saver_.saved_errno_ = 0;
  local_30._4_4_ = 0;
  local_38 = value;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestAllTypes*,decltype(nullptr)>
                          (&local_38,(void **)&local_30,"value != nullptr");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    value_arena = (Arena *)(local_38->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)value_arena & 1) != 0) {
      value_arena = *(Arena **)((ulong)value_arena & 0xfffffffffffffffe);
    }
    my_arena = this->arena_;
    if ((my_arena != value_arena) || (bVar2 = AllocatedSizeAtCapacity(this), bVar2)) {
      AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
                (this,local_38,value_arena,my_arena);
    }
    else {
      ppvVar5 = elements(this);
      iVar4 = this->current_size_;
      iVar3 = allocated_size(this);
      if (iVar4 < iVar3) {
        pvVar1 = ppvVar5[this->current_size_];
        iVar4 = allocated_size(this);
        ppvVar5[iVar4] = pvVar1;
      }
      iVar4 = this->current_size_;
      this->current_size_ = iVar4 + 1;
      ppvVar5[iVar4] = local_38;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar6 = rep(this);
        pRVar6->allocated_size = pRVar6->allocated_size + 1;
      }
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x1ba,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

void AddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    Arena* element_arena = TypeHandler::GetArena(value);
    Arena* arena = GetArena();
    if (arena != element_arena || AllocatedSizeAtCapacity()) {
      AddAllocatedSlowWithCopy<TypeHandler>(value, element_arena, arena);
      return;
    }
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at
    // least one slot that is not allocated).
    void** elems = elements();
    if (current_size_ < allocated_size()) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[allocated_size()] = elems[current_size_];
    }
    elems[ExchangeCurrentSize(current_size_ + 1)] = value;
    if (!using_sso()) ++rep()->allocated_size;
  }